

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

Var Js::JavascriptPromise::TriggerPromiseReactions
              (JavascriptPromiseReactionList *reactions,bool isRejecting,Var resolution,
              ScriptContext *scriptContext)

{
  NodeBase **addr;
  JavascriptLibrary *pJVar1;
  SListNodeBase<Memory::Recycler> *pSVar2;
  code *pcVar3;
  undefined1 auVar4 [8];
  bool bVar5;
  undefined4 *puVar6;
  Type *pTVar7;
  undefined1 local_48 [8];
  Iterator it;
  
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  if (reactions != (JavascriptPromiseReactionList *)0x0) {
    local_48 = (undefined1  [8])reactions;
    it.list = &reactions->
               super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    addr = &it.current;
    while( true ) {
      if (it.list ==
          (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar5) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      auVar4 = local_48;
      pSVar2 = ((it.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      it.current = pSVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      if ((undefined1  [8])it.current == auVar4) break;
      pSVar2 = ((it.list)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      it.current = pSVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      it.list = (SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                it.current;
      pTVar7 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data((Iterator *)local_48);
      EnqueuePromiseReactionTask((&pTVar7->resolveReaction)[isRejecting],resolution,scriptContext);
    }
  }
  return (pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
}

Assistant:

Var JavascriptPromise::TriggerPromiseReactions(JavascriptPromiseReactionList* reactions, bool isRejecting, Var resolution, ScriptContext* scriptContext)
    {
        JavascriptLibrary* library = scriptContext->GetLibrary();

        if (reactions != nullptr)
        {
            JavascriptPromiseReactionList::Iterator it = reactions->GetIterator();
            while (it.Next())
            {
                JavascriptPromiseReaction* reaction;
                if (isRejecting)
                {
                    reaction = it.Data().rejectReaction;
                }
                else
                {
                    reaction = it.Data().resolveReaction;
                }

                EnqueuePromiseReactionTask(reaction, resolution, scriptContext);
            }
        }

        return library->GetUndefined();
    }